

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINGetNumBacktrackOps(void *kinmem,long *nbacktr)

{
  undefined8 *in_RSI;
  long in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == 0) {
    KINProcessError((KINMem)0x0,-1,0x3e4,"KINGetNumBacktrackOps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0xf8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINGetNumBacktrackOps(void* kinmem, long int* nbacktr)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem  = (KINMem)kinmem;
  *nbacktr = kin_mem->kin_nbktrk;

  return (KIN_SUCCESS);
}